

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationDataBuilder::setPrimaryRangeAndReturnNext
          (CollationDataBuilder *this,UChar32 start,UChar32 end,uint32_t primary,int32_t step,
          UErrorCode *errorCode)

{
  UTrie2 *trie;
  UBool UVar1;
  UBool UVar2;
  uint32_t value;
  UBool isCompressible;
  UErrorCode *errorCode_local;
  int32_t step_local;
  uint32_t primary_local;
  UChar32 end_local;
  UChar32 start_local;
  CollationDataBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    UVar1 = isCompressiblePrimary(this,primary);
    UVar2 = maybeSetPrimaryRange(this,start,end,primary,step,errorCode);
    errorCode_local._4_4_ = primary;
    primary_local = start;
    if (UVar2 == '\0') {
      do {
        trie = this->trie;
        value = Collation::makeLongPrimaryCE32(errorCode_local._4_4_);
        utrie2_set32_63(trie,primary_local,value,errorCode);
        primary_local = primary_local + 1;
        errorCode_local._4_4_ =
             Collation::incThreeBytePrimaryByOffset(errorCode_local._4_4_,UVar1,step);
        this_local._4_4_ = errorCode_local._4_4_;
      } while ((int)primary_local <= end);
    }
    else {
      this_local._4_4_ =
           Collation::incThreeBytePrimaryByOffset(primary,UVar1,((end - start) + 1) * step);
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationDataBuilder::setPrimaryRangeAndReturnNext(UChar32 start, UChar32 end,
                                                   uint32_t primary, int32_t step,
                                                   UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    UBool isCompressible = isCompressiblePrimary(primary);
    if(maybeSetPrimaryRange(start, end, primary, step, errorCode)) {
        return Collation::incThreeBytePrimaryByOffset(primary, isCompressible,
                                                      (end - start + 1) * step);
    } else {
        // Short range: Set individual CE32s.
        for(;;) {
            utrie2_set32(trie, start, Collation::makeLongPrimaryCE32(primary), &errorCode);
            ++start;
            primary = Collation::incThreeBytePrimaryByOffset(primary, isCompressible, step);
            if(start > end) { return primary; }
        }
        modified = TRUE;
    }
}